

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

void __thiscall
flatbuffers::python::PythonGenerator::BuildFieldOfTable
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,size_t offset,
          string *code_ptr)

{
  IdlNamer *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  BaseType BVar5;
  Parser *pPVar6;
  long *plVar7;
  long *plVar8;
  size_type *psVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string field_var;
  string field_method;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  string field_ty;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  StructDef *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  size_t local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  pIVar1 = &this->namer_;
  local_120 = struct_def;
  (*(this->namer_).super_Namer._vptr_Namer[7])(&local_118,pIVar1);
  (*(this->namer_).super_Namer._vptr_Namer[4])(&local_f8,pIVar1,field);
  local_98 = offset;
  GenFieldTy_abi_cxx11_(&local_b8,this,field);
  bVar4 = (((this->super_BaseGenerator).parser_)->opts).python_no_type_prefix_suffix;
  if (bVar4 == true) {
    std::operator+(&local_d8,"Add",&local_f8);
  }
  else {
    (*(pIVar1->super_Namer)._vptr_Namer[0xf])(local_50,pIVar1,local_120);
    plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
    local_90 = &local_80;
    plVar8 = plVar7 + 2;
    if ((long *)*plVar7 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar7[3];
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar7;
    }
    local_88 = plVar7[1];
    *plVar7 = (long)plVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)local_f8._M_dataplus._M_p);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_d8.field_2._M_allocated_capacity = *psVar9;
      local_d8.field_2._8_8_ = plVar7[3];
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar9;
      local_d8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_d8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
  }
  if (bVar4 == false) {
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  std::operator+(&local_180,"def ",&local_d8);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_180._M_dataplus._M_p);
  paVar2 = &local_180.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((((this->super_BaseGenerator).parser_)->opts).python_typing == true) {
    std::operator+(&local_140,"(builder: flatbuffers.Builder, ",&local_118);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_160.field_2._M_allocated_capacity = *psVar9;
      local_160.field_2._8_8_ = plVar7[3];
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar9;
      local_160._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_160._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_160,(ulong)local_b8._M_dataplus._M_p);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_180.field_2._M_allocated_capacity = *psVar9;
      local_180.field_2._8_8_ = plVar7[3];
      local_180._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_180.field_2._M_allocated_capacity = *psVar9;
      local_180._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_180._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_180._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != paVar2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    uVar10 = local_140.field_2._M_allocated_capacity;
    _Var11._M_p = local_140._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
LAB_0028aea0:
      operator_delete(_Var11._M_p,uVar10 + 1);
    }
  }
  else {
    std::operator+(&local_180,"(builder, ",&local_118);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_180._M_dataplus._M_p);
    uVar10 = local_180.field_2._M_allocated_capacity;
    _Var11._M_p = local_180._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != paVar2) goto LAB_0028aea0;
  }
  std::__cxx11::string::append((char *)code_ptr);
  local_180._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,(anonymous_namespace)::Indent_abi_cxx11_,
             DAT_003f5f70 + (anonymous_namespace)::Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_180);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_180._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  GenMethod_abi_cxx11_(&local_160,this,field);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_180.field_2._M_allocated_capacity = *psVar9;
    local_180.field_2._8_8_ = plVar7[3];
    local_180._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.field_2._M_allocated_capacity = *psVar9;
    local_180._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_180._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_180._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_160.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar3) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  NumToString<unsigned_long>(&local_160,local_98);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_180.field_2._M_allocated_capacity = *psVar9;
    local_180.field_2._8_8_ = plVar7[3];
    local_180._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.field_2._M_allocated_capacity = *psVar9;
    local_180._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_180._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_180._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar3) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) || (local_120->fixed != false)) {
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_118._M_dataplus._M_p);
  }
  else {
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+(&local_160,"(",&local_118);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_180.field_2._M_allocated_capacity = *psVar9;
      local_180.field_2._8_8_ = plVar7[3];
      local_180._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_180.field_2._M_allocated_capacity = *psVar9;
      local_180._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_180._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_180._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != paVar2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar3) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)code_ptr);
  BVar5 = (field->value).type.base_type;
  if ((BVar5 - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    std::__cxx11::string::append((char *)code_ptr);
  }
  else if (BVar5 - BASE_TYPE_FLOAT < 2) {
    FloatConstantGenerator::GenFloatConstant_abi_cxx11_
              (&local_180,&(this->float_const_gen_).super_FloatConstantGenerator,field);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_180._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != paVar2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_append
              ((char *)code_ptr,(ulong)(field->value).constant._M_dataplus._M_p);
  }
  std::__cxx11::string::append((char *)code_ptr);
  pPVar6 = (this->super_BaseGenerator).parser_;
  if (((pPVar6->opts).one_file != false) || ((pPVar6->opts).python_no_type_prefix_suffix != false))
  goto LAB_0028b5ba;
  std::operator+(&local_180,"def Add",&local_f8);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_180._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((((this->super_BaseGenerator).parser_)->opts).python_typing == true) {
    std::operator+(&local_140,"(builder: flatbuffers.Builder, ",&local_118);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_160.field_2._M_allocated_capacity = *psVar9;
      local_160.field_2._8_8_ = plVar7[3];
      local_160._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar9;
      local_160._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_160._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_160,(ulong)local_b8._M_dataplus._M_p);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_180.field_2._M_allocated_capacity = *psVar9;
      local_180.field_2._8_8_ = plVar7[3];
      local_180._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_180.field_2._M_allocated_capacity = *psVar9;
      local_180._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_180._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_180._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != paVar2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar3) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
LAB_0028b3d3:
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::operator+(&local_180,"(builder, ",&local_118);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_180._M_dataplus._M_p);
    local_140.field_2._M_allocated_capacity = local_180.field_2._M_allocated_capacity;
    local_140._M_dataplus._M_p = local_180._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != paVar2) goto LAB_0028b3d3;
  }
  std::__cxx11::string::append((char *)code_ptr);
  (*(pIVar1->super_Namer)._vptr_Namer[0xf])(local_70,pIVar1,local_120);
  plVar7 = (long *)std::__cxx11::string::replace
                             ((ulong)local_70,0,(char *)0x0,(anonymous_namespace)::Indent_abi_cxx11_
                             );
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_140.field_2._M_allocated_capacity = *psVar9;
    local_140.field_2._8_8_ = plVar7[3];
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  }
  else {
    local_140.field_2._M_allocated_capacity = *psVar9;
    local_140._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_140._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_160.field_2._M_allocated_capacity = *psVar9;
    local_160.field_2._8_8_ = plVar7[3];
    local_160._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar9;
    local_160._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_160._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_160,(ulong)local_f8._M_dataplus._M_p);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_180.field_2._M_allocated_capacity = *psVar9;
    local_180.field_2._8_8_ = plVar7[3];
    local_180._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.field_2._M_allocated_capacity = *psVar9;
    local_180._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_180._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_180._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar3) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_118._M_dataplus._M_p);
  std::__cxx11::string::append((char *)code_ptr);
LAB_0028b5ba:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BuildFieldOfTable(const StructDef &struct_def, const FieldDef &field,
                         const size_t offset, std::string *code_ptr) const {
    auto &code = *code_ptr;
    const std::string field_var = namer_.Variable(field);
    const std::string field_method = namer_.Method(field);
    const std::string field_ty = GenFieldTy(field);

    const auto name = parser_.opts.python_no_type_prefix_suffix
                          ? "Add" + field_method
                          : namer_.Type(struct_def) + "Add" + field_method;

    // Generate method with struct name.
    code += "def " + name;
    if (parser_.opts.python_typing) {
      code += "(builder: flatbuffers.Builder, " + field_var + ": " + field_ty;
    } else {
      code += "(builder, " + field_var;
    }
    code += "):\n";
    code += Indent + "builder.Prepend";
    code += GenMethod(field) + "Slot(";
    code += NumToString(offset) + ", ";
    if (!IsScalar(field.value.type.base_type) && (!struct_def.fixed)) {
      code += "flatbuffers.number_types.UOffsetTFlags.py_type";
      code += "(" + field_var + ")";
    } else {
      code += field_var;
    }
    code += ", ";
    if (field.IsScalarOptional()) {
      code += "None";
    } else if (IsFloat(field.value.type.base_type)) {
      code += float_const_gen_.GenFloatConstant(field);
    } else {
      code += field.value.constant;
    }
    code += ")\n\n";

    if (!parser_.opts.one_file && !parser_.opts.python_no_type_prefix_suffix) {
      // Generate method without struct name.
      code += "def Add" + field_method;
      if (parser_.opts.python_typing) {
        code += "(builder: flatbuffers.Builder, " + field_var + ": " + field_ty;
      } else {
        code += "(builder, " + field_var;
      }
      code += "):\n";
      code += Indent + namer_.Type(struct_def) + "Add" + field_method;
      code += "(builder, ";
      code += field_var;
      code += ")\n\n";
    }
  }